

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O0

void units::addCustomCommodity(string *comm,uint32_t code)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8),
                     (memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  if (bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              (in_RDI);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              (in_RDI);
    __first._M_current._1_7_ = in_stack_ffffffffffffffc9;
    __first._M_current._0_1_ = in_stack_ffffffffffffffc8;
    __result._M_current._1_7_ = in_stack_ffffffffffffffb9;
    __result._M_current._0_1_ = in_stack_ffffffffffffffb8;
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (__first,in_stack_ffffffffffffffc0,__result,(_func_int_int *)in_stack_ffffffffffffffb0
              );
    pVar2 = std::
            unordered_map<unsigned_int,std::__cxx11::string,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
            ::emplace<unsigned_int&,std::__cxx11::string&>
                      ((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffc0._M_current,
                       (uint *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb0);
    std::
    unordered_map<std::__cxx11::string,unsigned_int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
    ::emplace<std::__cxx11::string&,unsigned_int&>
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)pVar2.first.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  ._M_cur.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8),
               (uint *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void addCustomCommodity(std::string comm, std::uint32_t code)
{
    if (allowCustomCommodities.load()) {
        std::transform(comm.begin(), comm.end(), comm.begin(), ::tolower);
        customCommodityNames.emplace(code, comm);
        customCommodityCodes.emplace(comm, code);
    }
}